

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O2

bool duckdb::FunctionSerializer::TypeRequiresAssignment(LogicalType *type)

{
  LogicalTypeId LVar1;
  element_type *peVar2;
  bool bVar3;
  
  do {
    LVar1 = type->id_;
    bVar3 = true;
    switch(LVar1) {
    case STRUCT:
      if ((type->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        peVar2 = (element_type *)StructType::GetChildCount(type);
LAB_005c286a:
        bVar3 = peVar2 == (element_type *)0x0;
      }
      return bVar3;
    case LIST:
      if ((type->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        return true;
      }
      type = ListType::GetChildType(type);
      break;
    case TABLE:
    case ENUM:
    case AGGREGATE_STATE:
    case LAMBDA:
      return false;
    case ARRAY:
      if ((type->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        return true;
      }
      type = ArrayType::GetChildType(type);
      break;
    default:
      if (LVar1 < UNKNOWN) {
        return true;
      }
      if (LVar1 == ANY) {
        return true;
      }
      if (LVar1 != DECIMAL) {
        return false;
      }
    case MAP:
    case UNION:
      peVar2 = (type->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      goto LAB_005c286a;
    }
  } while( true );
}

Assistant:

static bool TypeRequiresAssignment(const LogicalType &type) {
		switch (type.id()) {
		case LogicalTypeId::SQLNULL:
		case LogicalTypeId::ANY:
		case LogicalTypeId::INVALID:
			return true;
		case LogicalTypeId::DECIMAL:
		case LogicalTypeId::UNION:
		case LogicalTypeId::MAP:
			if (!type.AuxInfo()) {
				return true;
			}
			return false;
		case LogicalTypeId::LIST:
			if (!type.AuxInfo()) {
				return true;
			}
			return TypeRequiresAssignment(ListType::GetChildType(type));
		case LogicalTypeId::ARRAY:
			if (!type.AuxInfo()) {
				return true;
			}
			return TypeRequiresAssignment(ArrayType::GetChildType(type));
		case LogicalTypeId::STRUCT:
			if (!type.AuxInfo()) {
				return true;
			}
			if (StructType::GetChildCount(type) == 0) {
				return true;
			}
			return false;
		default:
			return false;
		}
	}